

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::Optimize(Inline *this,Func *func,Instr **callerArgOuts,ArgSlot callerArgOutCount,
                uint recursiveInlineDepth)

{
  OpCode OVar1;
  InlineCacheIndex inlineCacheIndex_00;
  uint uVar2;
  TSize TVar3;
  InliningHeuristics *pIVar4;
  Func *pFVar5;
  code *pcVar6;
  byte bVar7;
  Instr **ppIVar8;
  bool bVar9;
  ProfileId PVar10;
  ProfileId PVar11;
  uint uVar12;
  uint uVar13;
  JITTimeWorkItem *pJVar14;
  PragmaInstr *pPVar15;
  LabelInstr *pLVar16;
  BranchInstr *this_00;
  FldInfo *pFVar17;
  SymOpnd *this_01;
  SymOpnd *this_02;
  PropertySymOpnd *pPVar18;
  FunctionJITTimeInfo *pFVar19;
  char16_t *pcVar20;
  char16 *pcVar21;
  char16 *pcVar22;
  intptr_t iVar23;
  ThreadContextInfo *this_03;
  intptr_t iVar24;
  Opnd *this_04;
  ProfiledInstr *pPVar25;
  JITTimeFunctionBody *pJVar26;
  RegOpnd *pRVar27;
  Opnd *pOVar28;
  undefined4 *puVar29;
  char16_t *pcVar30;
  bool local_361;
  Instr *local_308;
  bool local_2c9;
  byte local_2b9;
  bool local_251;
  bool local_241;
  Opnd *local_240;
  bool local_221;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_212;
  ByteCodeUsesInstr *local_210;
  ByteCodeUsesInstr *useCallTargetInstr;
  bool safeThis;
  StackSym *pSStack_200;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  PropertySymOpnd *methodValueOpnd_1;
  LabelInstr *labelDestination;
  BranchInstr *branch;
  FunctionJITTimeInfo *inlineeData_3;
  anon_class_8_1_406103b2 aStack_1d0;
  ProfileId profileId_2;
  uint16 local_1c2;
  FunctionJITTimeInfo *pFStack_1c0;
  uint16 constantArguments_1;
  FunctionJITTimeInfo *inlineeData_2;
  ProfileId profileId_1;
  anon_class_8_1_406103b2 aStack_1b0;
  uint16 local_1a6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a4;
  byte local_1a2;
  bool local_1a1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a0;
  uint16 constantArguments;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_19c;
  bool hasDstUsedBuiltInReturnType;
  bool isInlinePhaseOff_1;
  wchar local_198 [2];
  ValueType builtInReturnType;
  OpCode builtInInlineCandidateOpCode;
  char16 debugStringBuffer_1 [42];
  wchar local_138 [4];
  char16 debugStringBuffer [42];
  Instr *pIStack_d8;
  ProfileId callSiteId;
  Instr *callbackDefInstr;
  FunctionJITTimeInfo *inlineeData_1;
  ProfileId profileId;
  PropertySymOpnd *methodValueOpnd;
  bool isInlinePhaseOff;
  JITTimeFunctionBody *body;
  FunctionJITTimeInfo *inlineeData;
  InlineCacheIndex inlineCacheIndex;
  SymOpnd *symOpnd;
  Opnd *opnd;
  bool getter;
  bool isCtor;
  bool isBuiltIn;
  bool isPolymorphic;
  Instr *pIStack_80;
  bool isInlined;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  LabelInstr *pLStack_60;
  int32 backEdgeCount;
  LabelInstr *loopTop;
  StackSym *symThis;
  FunctionJITTimeInfo *pFStack_48;
  bool doInline;
  FunctionJITTimeInfo *inlinerData;
  uint local_38;
  ArgSlot AStack_32;
  bool doFixedMethods;
  uint recursiveInlineDepth_local;
  ArgSlot callerArgOutCount_local;
  Instr **callerArgOuts_local;
  Func *func_local;
  Inline *this_local;
  
  local_38 = recursiveInlineDepth;
  AStack_32 = callerArgOutCount;
  _recursiveInlineDepth_local = callerArgOuts;
  callerArgOuts_local = (Instr **)func;
  func_local = (Func *)this;
  bVar9 = Func::DoInline(func);
  if (!bVar9) {
    return;
  }
  bVar9 = Func::DoInline(this->topFunc);
  if (!bVar9) {
    return;
  }
  uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
  uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar12,uVar13);
  inlinerData._7_1_ = (bVar9 ^ 0xffU) & 1;
  pJVar14 = Func::GetWorkItem((Func *)callerArgOuts_local);
  pFStack_48 = JITTimeWorkItem::GetJITTimeInfo(pJVar14);
  uVar12 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
  local_221 = true;
  if (uVar12 == 0) {
    local_221 = FunctionJITTimeInfo::IsLdFldInlineePresent(pFStack_48);
  }
  symThis._7_1_ = local_221;
  uVar12 = Func::GetSourceContextId(this->topFunc);
  uVar13 = Func::GetLocalFunctionId(this->topFunc);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar12,uVar13);
  if (!bVar9) {
    uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
    uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar12,uVar13);
    if ((!bVar9) && (bVar9 = Func::IsJitInDebugMode((Func *)callerArgOuts_local), !bVar9))
    goto LAB_0070a177;
  }
  symThis._7_1_ = 0;
LAB_0070a177:
  *(ArgSlot *)((long)callerArgOuts_local + 0x1e4) = AStack_32;
  this->currentForInDepth = *(uint *)((long)callerArgOuts_local + 0x1c4);
  loopTop = (LabelInstr *)0x0;
  this->lastStatementBoundary = (PragmaInstr *)0x0;
  pLStack_60 = (LabelInstr *)0x0;
  instrNext._4_4_ = 0;
  instr = (Instr *)0x0;
  pIStack_80 = callerArgOuts_local[0x19];
  do {
    if (pIStack_80 == instr) {
      uVar12 = Func::GetSourceContextId(this->topFunc);
      uVar13 = Func::GetLocalFunctionId(this->topFunc);
      bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlinePhase,uVar12,uVar13);
      if ((bVar9) || (bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase), bVar9)) {
        Output::Flush();
      }
      return;
    }
    instrStop = pIStack_80->m_next;
    opnd._7_1_ = 0;
    opnd._6_1_ = 0;
    opnd._5_1_ = 0;
    opnd._4_1_ = 0;
    if ((symThis._7_1_ & 1) != 0) {
      OVar1 = pIStack_80->m_opcode;
      if (OVar1 == CallI) {
LAB_0070a982:
        pPVar18 = GetMethodLdOpndForCallInstr(this,pIStack_80);
        uVar12 = this->inlineesProcessed;
        uVar13 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
        if (uVar12 == uVar13) {
          TryResetObjTypeSpecFldInfoOn(this,pPVar18);
          TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
        }
        else {
          bVar9 = IR::Instr::IsProfiledInstr(pIStack_80);
          if (bVar9) {
            pPVar25 = IR::Instr::AsProfiledInstr(pIStack_80);
            uVar2 = (pPVar25->u).profileId;
            PVar11 = (ProfileId)uVar2;
            pJVar26 = Func::GetJITFunctionBody((Func *)callerArgOuts_local);
            PVar10 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar26);
            if ((uVar2 & 0xffff) < (uint)PVar10) {
              callbackDefInstr = (Instr *)FunctionJITTimeInfo::GetInlinee(pFStack_48,PVar11);
              pIStack_d8 = (Instr *)0x0;
              if (callbackDefInstr == (Instr *)0x0) {
                bVar9 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>((Func *)callerArgOuts_local)
                ;
                if (bVar9) {
                  pIStack_d8 = TryGetCallbackDefInstrForCallInstr(this,pIStack_80);
                }
                if (pIStack_d8 == (Instr *)0x0) {
                  TryResetObjTypeSpecFldInfoOn(this,pPVar18);
                  TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
                  goto LAB_0070be36;
                }
              }
              if ((callbackDefInstr != (Instr *)0x0) &&
                 (bVar9 = FunctionJITTimeInfo::IsPolymorphicCallSite(pFStack_48,PVar11), bVar9)) {
                bVar9 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>((Func *)callerArgOuts_local)
                ;
                if (bVar9) {
                  pIStack_d8 = TryGetCallbackDefInstrForCallInstr(this,pIStack_80);
                  if (pIStack_d8 == (Instr *)0x0) {
                    opnd._6_1_ = 1;
                  }
                }
                else {
                  opnd._6_1_ = 1;
                }
              }
              if (pIStack_d8 != (Instr *)0x0) {
                pPVar25 = IR::Instr::AsProfiledInstr(pIStack_d8);
                TVar3 = (pPVar25->u).field_3.fldInfoData;
                pJVar14 = Func::GetWorkItem(pIStack_d8->m_func);
                pFVar19 = JITTimeWorkItem::GetJITTimeInfo(pJVar14);
                callbackDefInstr =
                     (Instr *)FunctionJITTimeInfo::GetCallbackInlinee(pFVar19,TVar3.f1);
                uVar12 = Func::GetSourceContextId(this->topFunc);
                uVar13 = Func::GetLocalFunctionId(this->topFunc);
                bVar9 = Js::Phases::IsEnabled
                                  ((Phases *)&DAT_01ec73f0,InlineCallbacksPhase,uVar12,uVar13);
                if (!bVar9) {
                  uVar12 = Func::GetSourceContextId(this->topFunc);
                  uVar13 = Func::GetLocalFunctionId(this->topFunc);
                  bVar9 = Js::Phases::IsEnabled
                                    ((Phases *)&DAT_01ec1678,InlineCallbacksPhase,uVar12,uVar13);
                  if (!bVar9) goto LAB_0070acba;
                }
                pJVar26 = FunctionJITTimeInfo::GetBody(pFStack_48);
                pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar26);
                pcVar22 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (pFStack_48,(wchar (*) [42])local_138);
                Output::Print(L"INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n",
                              (ulong)((uint)TVar3 & 0xffff),pcVar21,pcVar22);
                Output::Flush();
              }
LAB_0070acba:
              if ((opnd._6_1_ & 1) == 0) {
                TryResetObjTypeSpecFldInfoOn(this,pPVar18);
                TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
                ValueType::ValueType((ValueType *)&local_19c.field_0);
                if ((opnd._4_1_ & 1) != 0) {
                  iVar23 = FunctionJITTimeInfo::GetFunctionInfoAddr
                                     ((FunctionJITTimeInfo *)callbackDefInstr);
                  this_03 = Func::GetThreadContextInfo(this->topFunc);
                  iVar24 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr(this_03);
                  if (iVar23 == iVar24) {
                    opnd._5_1_ = 1;
                    pIStack_80->m_opcode = NewScObjArray;
                    pPVar25 = IR::Instr::AsProfiledInstr(pIStack_80);
                    (pPVar25->u).profileId = 0xffff;
                    goto LAB_0070be36;
                  }
                }
                opnd._5_1_ = InliningDecider::GetBuiltInInfo
                                       ((FunctionJITTimeInfo *)callbackDefInstr,
                                        (OpCode *)&hasDstUsedBuiltInReturnType,
                                        (ValueType *)&local_19c.field_0);
                bVar9 = ValueType::IsUninitialized((ValueType *)&local_19c.field_0);
                if ((!bVar9) && (pOVar28 = IR::Instr::GetDst(pIStack_80), pOVar28 != (Opnd *)0x0)) {
                  bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)callbackDefInstr);
                  if (bVar9) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar29 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x12a,"(!inlineeData->HasBody())","!inlineeData->HasBody()")
                    ;
                    if (!bVar9) {
                      pcVar6 = (code *)invalidInstructionException();
                      (*pcVar6)();
                    }
                    puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar29 = 0;
                  }
                  if (pIStack_80->m_opcode == NewScObjArray) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar29 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,299,"(instr->m_opcode != Js::OpCode::NewScObjArray)",
                                       "We should have broken out of the switch statement earlier on this opcode."
                                      );
                    if (!bVar9) {
                      pcVar6 = (code *)invalidInstructionException();
                      (*pcVar6)();
                    }
                    puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar29 = 0;
                  }
                  local_2b9 = 1;
                  if (pIStack_80->m_opcode == NewScObjArray) {
                    pOVar28 = IR::Instr::GetDst(pIStack_80);
                    constantArguments = (uint16)IR::Opnd::GetValueType(pOVar28);
                    bVar9 = ValueType::IsLikelyNativeArray((ValueType *)&constantArguments);
                    local_2b9 = bVar9 ^ 0xff;
                  }
                  if ((local_2b9 & 1) != 0) {
                    pOVar28 = IR::Instr::GetDst(pIStack_80);
                    local_1a0.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::ToLikely((ValueType *)&local_19c.field_0);
                    IR::Opnd::SetValueType(pOVar28,(ValueType)local_1a0.field_0);
                  }
                }
                bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)callbackDefInstr);
                if (bVar9) {
                  uVar12 = FunctionJITTimeInfo::GetSourceContextId
                                     ((FunctionJITTimeInfo *)callbackDefInstr);
                  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId
                                     ((FunctionJITTimeInfo *)callbackDefInstr);
                  local_2c9 = Js::Phases::IsEnabled
                                        ((Phases *)&DAT_01eafdf0,InlineCandidatePhase,uVar12,uVar13)
                  ;
                }
                else {
                  local_2c9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineBuiltInPhase);
                }
                local_1a1 = local_2c9;
                if ((local_2c9 == false) &&
                   ((bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)callbackDefInstr),
                    bVar9 || (bVar9 = Js::operator==((OpCode *)&hasDstUsedBuiltInReturnType,0),
                             !bVar9)))) {
                  local_1a2 = 0;
                  bVar9 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)callbackDefInstr);
                  if (bVar9) {
                    pJVar26 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)callbackDefInstr);
                    bVar9 = JITTimeFunctionBody::HasProfileInfo(pJVar26);
                    if (bVar9) {
                      local_1a6 = 0;
                      uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
                      uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
                      bVar9 = Js::Phases::IsEnabled
                                        ((Phases *)&DAT_01eafdf0,InlineRecursivePhase,uVar12,uVar13)
                      ;
                      if (!bVar9) {
                        aStack_1b0.constantArguments = &local_1a6;
                        IR::Instr::
                        IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__0>
                                  (pIStack_80,aStack_1b0);
                      }
                      ppIVar8 = callerArgOuts_local;
                      bVar7 = opnd._4_1_;
                      pIVar4 = this->inliningHeuristics;
                      pFVar5 = this->topFunc;
                      bVar9 = IsInliningOutSideLoops(this);
                      bVar9 = InliningHeuristics::BackendInlineIntoInliner
                                        (pIVar4,(FunctionJITTimeInfo *)callbackDefInstr,
                                         (Func *)ppIVar8,pFVar5,PVar11,(bool)(bVar7 & 1),true,bVar9,
                                         this->isInLoop != 0,local_38,local_1a6);
                      if (bVar9) goto LAB_0070b5c3;
                    }
                  }
                  else {
                    bVar9 = Js::operator!=((OpCode *)&hasDstUsedBuiltInReturnType,0);
                    if (!bVar9) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar29 = 1;
                      bVar9 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                         ,0x146,"(builtInInlineCandidateOpCode != 0)",
                                         "builtInInlineCandidateOpCode != 0");
                      if (!bVar9) {
                        pcVar6 = (code *)invalidInstructionException();
                        (*pcVar6)();
                      }
                      puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar29 = 0;
                    }
                    if ((opnd._4_1_ & 1) == 0) {
                      bVar9 = ValueType::IsUninitialized((ValueType *)&local_19c.field_0);
                      if ((!bVar9) &&
                         (pOVar28 = IR::Instr::GetDst(pIStack_80), pOVar28 != (Opnd *)0x0)) {
                        local_1a2 = 1;
                        pOVar28 = IR::Instr::GetDst(pIStack_80);
                        local_1a4.field_0 = local_19c.field_0;
                        IR::Opnd::SetValueType(pOVar28,(ValueType)local_19c.field_0);
                        bVar9 = ValueType::IsDefinite((ValueType *)&local_19c.field_0);
                        if (bVar9) {
                          pOVar28 = IR::Instr::GetDst(pIStack_80);
                          IR::Opnd::SetValueTypeFixed(pOVar28);
                        }
                      }
LAB_0070b5c3:
                      bVar9 = Js::operator!=((OpCode *)&hasDstUsedBuiltInReturnType,0);
                      if (bVar9) {
                        local_308 = InlineBuiltInFunction
                                              (this,pIStack_80,
                                               (FunctionJITTimeInfo *)callbackDefInstr,
                                               _hasDstUsedBuiltInReturnType,pFStack_48,
                                               (StackSym *)loopTop,(bool *)((long)&opnd + 7),
                                               uVar2 & 0xffff,local_38,pIStack_80);
                      }
                      else {
                        local_308 = InlineScriptFunction
                                              (this,pIStack_80,
                                               (FunctionJITTimeInfo *)callbackDefInstr,
                                               (StackSym *)loopTop,PVar11,(bool *)((long)&opnd + 7),
                                               pIStack_d8,local_38);
                      }
                      instrStop = local_308;
                      if (((opnd._7_1_ & 1) == 0) && ((local_1a2 & 1) != 0)) {
                        pOVar28 = IR::Instr::GetDst(pIStack_80);
                        IR::Opnd::UnsetValueTypeFixed(pOVar28);
                        pOVar28 = IR::Instr::GetDst(pIStack_80);
                        this_04 = IR::Instr::GetDst(pIStack_80);
                        inlineeData_2._4_2_ =
                             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0
                              )IR::Opnd::GetValueType(this_04);
                        inlineeData_2._6_2_ =
                             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0
                              )ValueType::ToLikely((ValueType *)((long)&inlineeData_2 + 4));
                        IR::Opnd::SetValueType(pOVar28,(ValueType)inlineeData_2._6_2_);
                      }
                      goto LAB_0070b6ef;
                    }
                  }
                }
              }
              else {
                if ((opnd._4_1_ & 1) == 0) {
                  uVar12 = Func::GetSourceContextId(this->topFunc);
                  uVar13 = Func::GetLocalFunctionId(this->topFunc);
                  bVar9 = Js::Phases::IsEnabled
                                    ((Phases *)&DAT_01eafdf0,PolymorphicInlinePhase,uVar12,uVar13);
                  if (!bVar9) {
                    uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
                    uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
                    bVar9 = Js::Phases::IsEnabled
                                      ((Phases *)&DAT_01eafdf0,PolymorphicInlinePhase,uVar12,uVar13)
                    ;
                    if (!bVar9) {
                      bVar9 = IsInliningOutSideLoops(this);
                      if (bVar9) {
                        uVar12 = Func::GetSourceContextId(this->topFunc);
                        uVar13 = Func::GetLocalFunctionId(this->topFunc);
                        bVar9 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01ea41a0,InlinePhase,uVar12,uVar13);
                        if (!bVar9) {
                          uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
                          uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
                          bVar9 = Js::Phases::IsEnabled
                                            ((Phases *)&DAT_01ea41a0,InlinePhase,uVar12,uVar13);
                          if (!bVar9) goto LAB_0070adff;
                        }
                      }
                      uVar12 = Func::GetSourceContextId(this->topFunc);
                      uVar13 = Func::GetLocalFunctionId(this->topFunc);
                      bVar9 = Js::Phases::IsEnabled
                                        ((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar12,uVar13);
                      if (!bVar9) {
                        uVar12 = Func::GetSourceContextId(this->topFunc);
                        uVar13 = Func::GetLocalFunctionId(this->topFunc);
                        bVar9 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01eafdf0,
                                           PolymorphicInlineFixedMethodsPhase,uVar12,uVar13);
                        if (!bVar9) {
                          instrStop = InlinePolymorphicFunctionUsingFixedMethods
                                                (this,pIStack_80,pFStack_48,(StackSym *)loopTop,
                                                 PVar11,pPVar18,(bool *)((long)&opnd + 7),local_38);
                          goto LAB_0070b6ef;
                        }
                      }
                      TryResetObjTypeSpecFldInfoOn(this,pPVar18);
                      TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
                      instrStop = InlinePolymorphicFunction
                                            (this,pIStack_80,pFStack_48,(StackSym *)loopTop,PVar11,
                                             (bool *)((long)&opnd + 7),local_38,false);
LAB_0070b6ef:
                      uVar13 = this->inlineesProcessed + 1;
                      this->inlineesProcessed = uVar13;
                      uVar12 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
                      if (((uVar13 == uVar12) &&
                          (bVar9 = FunctionJITTimeInfo::IsLdFldInlineePresent(pFStack_48), !bVar9))
                         && ((inlinerData._7_1_ & 1) == 0)) {
                        return;
                      }
                      goto LAB_0070be36;
                    }
                  }
                }
LAB_0070adff:
                bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
                if (bVar9) {
                  pcVar30 = L"false";
                  if ((opnd._4_1_ & 1) != 0) {
                    pcVar30 = L"true";
                  }
                  pcVar20 = L"false";
                  if (this->topFunc != (Func *)callerArgOuts_local) {
                    pcVar20 = L"true";
                  }
                  pJVar26 = FunctionJITTimeInfo::GetBody(pFStack_48);
                  pcVar21 = JITTimeFunctionBody::GetDisplayName(pJVar26);
                  pcVar22 = FunctionJITTimeInfo::GetDebugNumberSet
                                      (pFStack_48,(wchar (*) [42])local_198);
                  Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                                ,pcVar30,pcVar20,pcVar21,pcVar22);
                  Output::Flush();
                }
                TryResetObjTypeSpecFldInfoOn(this,pPVar18);
                TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
              }
            }
            else {
              TryResetObjTypeSpecFldInfoOn(this,pPVar18);
              TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
            }
          }
          else {
            TryResetObjTypeSpecFldInfoOn(this,pPVar18);
            TryDisableRuntimePolymorphicCacheOn(this,pPVar18);
          }
        }
      }
      else if (OVar1 == CallIExtended) {
        uVar12 = this->inlineesProcessed;
        uVar13 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
        if ((uVar12 != uVar13) && (bVar9 = IR::Instr::IsProfiledInstr(pIStack_80), bVar9)) {
          pPVar25 = IR::Instr::AsProfiledInstr(pIStack_80);
          TVar3 = (pPVar25->u).field_3.fldInfoData;
          inlineeData_3._6_2_ = TVar3.f1;
          pJVar26 = Func::GetJITFunctionBody((Func *)callerArgOuts_local);
          PVar11 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar26);
          if ((((uint)TVar3 & 0xffff) < (uint)PVar11) &&
             ((branch = (BranchInstr *)
                        FunctionJITTimeInfo::GetInlinee(pFStack_48,inlineeData_3._6_2_),
              branch != (BranchInstr *)0x0 && (bVar9 = Lowerer::IsSpreadCall(pIStack_80), bVar9))))
          {
            InlineSpread(this,pIStack_80);
          }
        }
      }
      else if (OVar1 == ArgOut_A) {
        InlConstFoldArg(this,pIStack_80,_recursiveInlineDepth_local,AStack_32);
      }
      else if (((OVar1 == LdFld) || (OVar1 == LdFldForCallApplyTarget)) || (OVar1 == StFld)) {
        bVar9 = FunctionJITTimeInfo::IsLdFldInlineePresent(pFStack_48);
        if ((bVar9) && (bVar9 = IR::Instr::IsProfiledInstr(pIStack_80), bVar9)) {
          pPVar25 = IR::Instr::AsProfiledInstr(pIStack_80);
          pFVar17 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                              ((anon_union_8_4_88fdcd80 *)&(pPVar25->u).field_3);
          if ((pFVar17->flags & FldInfo_FromAccessor) != FldInfo_NoInfo) {
            opnd._3_1_ = pIStack_80->m_opcode != StFld;
            if ((bool)opnd._3_1_) {
              local_240 = IR::Instr::GetSrc1(pIStack_80);
            }
            else {
              local_240 = IR::Instr::GetDst(pIStack_80);
            }
            if ((local_240 != (Opnd *)0x0) && (bVar9 = IR::Opnd::IsSymOpnd(local_240), bVar9)) {
              this_01 = IR::Opnd::AsSymOpnd(local_240);
              bVar9 = Sym::IsPropertySym(this_01->m_sym);
              if (bVar9) {
                this_02 = IR::Opnd::AsSymOpnd(&this_01->super_Opnd);
                bVar9 = IR::SymOpnd::IsPropertySymOpnd(this_02);
                if (!bVar9) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar29 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                     ,0x83,"(symOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                                     "symOpnd->AsSymOpnd()->IsPropertySymOpnd()");
                  if (!bVar9) {
                    pcVar6 = (code *)invalidInstructionException();
                    (*pcVar6)();
                  }
                  puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar29 = 0;
                }
                pPVar18 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd);
                inlineCacheIndex_00 = pPVar18->m_inlineCacheIndex;
                pFVar19 = FunctionJITTimeInfo::GetLdFldInlinee(pFStack_48,inlineCacheIndex_00);
                if ((pFVar19 != (FunctionJITTimeInfo *)0x0) &&
                   (pJVar26 = FunctionJITTimeInfo::GetBody(pFVar19),
                   pJVar26 != (JITTimeFunctionBody *)0x0)) {
                  uVar12 = FunctionJITTimeInfo::GetSourceContextId(pFVar19);
                  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar19);
                  bVar9 = Js::Phases::IsEnabled
                                    ((Phases *)&DAT_01eafdf0,InlineCandidatePhase,uVar12,uVar13);
                  local_241 = true;
                  if (!bVar9) {
                    uVar12 = FunctionJITTimeInfo::GetSourceContextId(pFVar19);
                    uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar19);
                    bVar9 = Js::Phases::IsEnabled
                                      ((Phases *)&DAT_01eafdf0,InlineAccessorsPhase,uVar12,uVar13);
                    local_241 = true;
                    if (!bVar9) {
                      if ((opnd._3_1_ & 1) != 0) {
                        uVar12 = FunctionJITTimeInfo::GetSourceContextId(pFVar19);
                        uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar19);
                        bVar9 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01eafdf0,InlineGettersPhase,uVar12,uVar13)
                        ;
                        local_241 = true;
                        if (bVar9) goto LAB_0070a8c0;
                      }
                      local_251 = false;
                      if ((opnd._3_1_ & 1) == 0) {
                        uVar12 = FunctionJITTimeInfo::GetSourceContextId(pFVar19);
                        uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar19);
                        local_251 = Js::Phases::IsEnabled
                                              ((Phases *)&DAT_01eafdf0,InlineSettersPhase,uVar12,
                                               uVar13);
                      }
                      local_241 = local_251;
                    }
                  }
LAB_0070a8c0:
                  if (local_241 == false) {
                    InlineGetterSetterFunction
                              (this,pIStack_80,pFVar19,(StackSym *)loopTop,inlineCacheIndex_00,
                               (bool)(opnd._3_1_ & 1),(bool *)((long)&opnd + 7),local_38);
                  }
                }
              }
            }
          }
        }
      }
      else if (OVar1 == LdThis) {
        pOVar28 = IR::Instr::GetDst(pIStack_80);
        if (pOVar28 == (Opnd *)0x0) {
LAB_0070bb0e:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x210,"(instr->GetDst() && instr->GetDst()->IsRegOpnd())",
                             "instr->GetDst() && instr->GetDst()->IsRegOpnd()");
          if (!bVar9) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 0;
        }
        else {
          pOVar28 = IR::Instr::GetDst(pIStack_80);
          bVar9 = IR::Opnd::IsRegOpnd(pOVar28);
          if (!bVar9) goto LAB_0070bb0e;
        }
        if (loopTop != (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x211,"(symThis == nullptr)","symThis == nullptr");
          if (!bVar9) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 0;
        }
        pOVar28 = IR::Instr::GetDst(pIStack_80);
        pRVar27 = IR::Opnd::AsRegOpnd(pOVar28);
        loopTop = (LabelInstr *)pRVar27->m_sym;
      }
      else if (OVar1 == NewScObject) {
        opnd._4_1_ = 1;
        uVar12 = Func::GetSourceContextId(this->topFunc);
        uVar13 = Func::GetLocalFunctionId(this->topFunc);
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineConstructorsPhase,uVar12,uVar13)
        ;
        if (!bVar9) goto LAB_0070a982;
      }
      else if (OVar1 == NewScObjArray) {
        opnd._4_1_ = 1;
        opnd._5_1_ = 1;
      }
      else if (OVar1 == InitForInEnumerator) {
        bVar9 = Func::IsLoopBody((Func *)callerArgOuts_local);
        if (!bVar9) {
          this->currentForInDepth = this->currentForInDepth + 1;
        }
      }
      else if (OVar1 == BrOnEmpty) {
        bVar9 = Func::IsLoopBody((Func *)callerArgOuts_local);
        if (!bVar9) {
          this_00 = IR::Instr::AsBranchInstr(pIStack_80);
          pLVar16 = IR::BranchInstr::GetTarget(this_00);
          pLVar16->field_0x78 = pLVar16->field_0x78 & 0xef | 0x10;
        }
      }
      else if (OVar1 == Label) {
        if ((pLStack_60 == (LabelInstr *)0x0) &&
           (pLVar16 = IR::Instr::AsLabelInstr(pIStack_80), (pLVar16->field_0x78 & 1) != 0)) {
          pLStack_60 = IR::Instr::AsLabelInstr(pIStack_80);
          if (pLStack_60 == (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x42,"(loopTop)","loopTop");
            if (!bVar9) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 0;
          }
          this->isInLoop = this->isInLoop + 1;
          instrNext._4_4_ =
               RealCount::Count(&(pLStack_60->labelRefs).
                                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                                 super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                 .super_RealCount);
        }
        pLVar16 = IR::Instr::AsLabelInstr(pIStack_80);
        if (((byte)pLVar16->field_0x78 >> 4 & 1) != 0) {
          if (this->currentForInDepth == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x49,"(this->currentForInDepth != 0)","this->currentForInDepth != 0"
                              );
            if (!bVar9) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 0;
          }
          this->currentForInDepth = this->currentForInDepth - 1;
        }
      }
      else if (OVar1 == StatementBoundary) {
        pPVar15 = IR::Instr::AsPragmaInstr(pIStack_80);
        this->lastStatementBoundary = pPVar15;
      }
      else if (OVar1 == AsmJsCallI) {
        uVar12 = this->inlineesProcessed;
        uVar13 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
        if ((uVar12 != uVar13) && (bVar9 = IR::Instr::IsProfiledInstr(pIStack_80), bVar9)) {
          pPVar25 = IR::Instr::AsProfiledInstr(pIStack_80);
          TVar3 = (pPVar25->u).field_3.fldInfoData;
          inlineeData_2._2_2_ = TVar3.f1;
          pJVar26 = Func::GetJITFunctionBody((Func *)callerArgOuts_local);
          PVar11 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar26);
          if ((((uint)TVar3 & 0xffff) < (uint)PVar11) &&
             (pFStack_1c0 = FunctionJITTimeInfo::GetInlinee(pFStack_48,inlineeData_2._2_2_),
             pFStack_1c0 != (FunctionJITTimeInfo *)0x0)) {
            uVar12 = FunctionJITTimeInfo::GetSourceContextId(pFStack_1c0);
            uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFStack_1c0);
            bVar9 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_01eafdf0,InlineCandidatePhase,uVar12,uVar13);
            if (!bVar9) {
              pJVar26 = FunctionJITTimeInfo::GetBody(pFStack_1c0);
              bVar9 = JITTimeFunctionBody::HasProfileInfo(pJVar26);
              if (bVar9) {
                local_1c2 = 0;
                uVar12 = Func::GetSourceContextId((Func *)callerArgOuts_local);
                uVar13 = Func::GetLocalFunctionId((Func *)callerArgOuts_local);
                bVar9 = Js::Phases::IsEnabled
                                  ((Phases *)&DAT_01eafdf0,InlineRecursivePhase,uVar12,uVar13);
                if (!bVar9) {
                  aStack_1d0.constantArguments = &local_1c2;
                  IR::Instr::
                  IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__1>
                            (pIStack_80,aStack_1d0);
                }
                ppIVar8 = callerArgOuts_local;
                bVar7 = opnd._4_1_;
                PVar11 = inlineeData_2._2_2_;
                pFVar19 = pFStack_1c0;
                pIVar4 = this->inliningHeuristics;
                pFVar5 = this->topFunc;
                bVar9 = IsInliningOutSideLoops(this);
                bVar9 = InliningHeuristics::BackendInlineIntoInliner
                                  (pIVar4,pFVar19,(Func *)ppIVar8,pFVar5,PVar11,(bool)(bVar7 & 1),
                                   true,bVar9,this->isInLoop != 0,local_38,local_1c2);
                if (bVar9) {
                  instrStop = InlineScriptFunction
                                        (this,pIStack_80,pFStack_1c0,(StackSym *)loopTop,
                                         inlineeData_2._2_2_,(bool *)((long)&opnd + 7),(Instr *)0x0,
                                         local_38);
                  uVar13 = this->inlineesProcessed + 1;
                  this->inlineesProcessed = uVar13;
                  uVar12 = FunctionJITTimeInfo::GetInlineeCount(pFStack_48);
                  if (uVar13 == uVar12) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
      else if (OVar1 == CheckThis) {
        pOVar28 = IR::Instr::GetSrc1(pIStack_80);
        if (pOVar28 == (Opnd *)0x0) {
LAB_0070bc35:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x218,"(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())",
                             "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd()");
          if (!bVar9) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 0;
        }
        else {
          pOVar28 = IR::Instr::GetSrc1(pIStack_80);
          bVar9 = IR::Opnd::IsRegOpnd(pOVar28);
          if (!bVar9) goto LAB_0070bc35;
        }
        if (loopTop != (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x219,"(symThis == nullptr)","symThis == nullptr");
          if (!bVar9) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 0;
        }
        pOVar28 = IR::Instr::GetSrc1(pIStack_80);
        pRVar27 = IR::Opnd::AsRegOpnd(pOVar28);
        loopTop = (LabelInstr *)pRVar27->m_sym;
      }
      else if (OVar1 == BrOnNotEmpty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar29 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x58,"(false)","false");
        if (!bVar9) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar29 = 0;
      }
      else if ((pLStack_60 != (LabelInstr *)0x0) &&
              (bVar9 = IR::Instr::IsBranchInstr(pIStack_80), bVar9)) {
        labelDestination = (LabelInstr *)IR::Instr::AsBranchInstr(pIStack_80);
        methodValueOpnd_1 =
             (PropertySymOpnd *)IR::BranchInstr::GetTarget((BranchInstr *)labelDestination);
        if (((LabelInstr *)methodValueOpnd_1 == pLStack_60) &&
           (instrNext._4_4_ = instrNext._4_4_ - 1, instrNext._4_4_ == 0)) {
          if (this->isInLoop == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x22a,"(this->isInLoop > 0)","this->isInLoop > 0");
            if (!bVar9) {
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar29 = 0;
          }
          this->isInLoop = this->isInLoop - 1;
          pLStack_60 = (LabelInstr *)0x0;
        }
      }
    }
LAB_0070be36:
    if ((opnd._7_1_ & 1) == 0) {
      OVar1 = pIStack_80->m_opcode;
      if (OVar1 != CallI) {
        if ((OVar1 != NewScObject) && (OVar1 != NewScObjArray)) goto LAB_0070c10d;
        opnd._4_1_ = 1;
      }
      originalCallTargetStackSym = (StackSym *)GetMethodLdOpndForCallInstr(this,pIStack_80);
      TryResetObjTypeSpecFldInfoOn(this,(PropertySymOpnd *)originalCallTargetStackSym);
      TryDisableRuntimePolymorphicCacheOn(this,(PropertySymOpnd *)originalCallTargetStackSym);
      pOVar28 = IR::Instr::GetSrc1(pIStack_80);
      pSStack_200 = IR::Opnd::GetStackSym(pOVar28);
      pOVar28 = IR::Instr::GetSrc1(pIStack_80);
      useCallTargetInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar28);
      useCallTargetInstr._6_1_ = 0;
      bVar9 = TryOptimizeCallInstrWithFixedMethod
                        (this,pIStack_80,(FunctionJITTimeInfo *)0x0,(bool)(opnd._6_1_ & 1),
                         (bool)(opnd._5_1_ & 1),(bool)(opnd._4_1_ & 1),false,
                         (bool *)((long)&useCallTargetInstr + 6),false,0);
      if (bVar9) {
        if (pSStack_200 == (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x249,"(originalCallTargetStackSym != nullptr)",
                             "originalCallTargetStackSym != nullptr");
          if (!bVar9) {
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          puVar29 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar29 = 0;
        }
        local_210 = IR::ByteCodeUsesInstr::New(pIStack_80);
        IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                  (local_210,(bool)(useCallTargetInstr._7_1_ & 1),(pSStack_200->super_Sym).m_id);
        IR::Instr::InsertBefore(pIStack_80,&local_210->super_Instr);
        if (pIStack_80->m_opcode == NewScObject) {
          uVar12 = Func::GetSourceContextId(this->topFunc);
          uVar13 = Func::GetLocalFunctionId(this->topFunc);
          bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,SplitNewScObjectPhase,uVar12,uVar13)
          ;
          if (!bVar9) {
            SplitConstructorCall(this,pIStack_80,false,true,(Instr **)0x0,(Instr **)0x0);
          }
        }
      }
      else if (pIStack_80->m_opcode == NewScObjArray) {
        pOVar28 = IR::Instr::GetDst(pIStack_80);
        local_361 = false;
        if (pOVar28 != (Opnd *)0x0) {
          pOVar28 = IR::Instr::GetDst(pIStack_80);
          local_212.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(pOVar28);
          local_361 = ValueType::IsLikelyNativeArray((ValueType *)&local_212.field_0);
        }
        if (local_361 != false) {
          IR::Instr::ConvertToBailOutInstr(pIStack_80,pIStack_80,BailOutOnNotNativeArray,0xffffffff)
          ;
        }
      }
    }
LAB_0070c10d:
    pIStack_80 = instrStop;
  } while( true );
}

Assistant:

void
Inline::Optimize(Func *func, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount, uint recursiveInlineDepth)
{
    if (!func->DoInline() || !topFunc->DoInline())
    {
        return;
    }

    bool doFixedMethods = !PHASE_OFF(Js::FixedMethodsPhase, func);
    const FunctionJITTimeInfo * inlinerData = func->GetWorkItem()->GetJITTimeInfo();

    bool doInline = (inlinerData->GetInlineeCount() > 0 || inlinerData->IsLdFldInlineePresent());
    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, func) ||
        func->IsJitInDebugMode())
    {
        doInline = false;
    }

    func->actualCount = callerArgOutCount;

    // Current for..in depth starts with the inlinee's base depth
    this->currentForInDepth = func->m_forInLoopBaseDepth;

    // Keep the caller's "this" symbol (if any).
    StackSym *symThis = nullptr;
    lastStatementBoundary = nullptr;
    IR::LabelInstr* loopTop = nullptr;
    int32 backEdgeCount = 0;

    // Profile data already filter call site outside of loops if the function has loops, so we don't need to detect that here.
    FOREACH_INSTR_EDITING(instr, instrNext, func->m_headInstr)
    {
        bool isInlined = false;
        bool isPolymorphic = false;
        bool isBuiltIn = false;
        bool isCtor = false;
        if (doInline)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::StatementBoundary:
                lastStatementBoundary = instr->AsPragmaInstr();
                break;

            case Js::OpCode::Label:
                {
                    if (!loopTop && instr->AsLabelInstr()->m_isLoopTop)
                    {
                        // We only need to know if we are inside loop or not, it doesn't matter how many nested levels we are in.
                        // This is the cheap way of doing so.
                        loopTop = instr->AsLabelInstr();
                        AnalysisAssert(loopTop);
                        this->isInLoop++;
                        backEdgeCount = loopTop->labelRefs.Count();
                    }

                    if (instr->AsLabelInstr()->m_isForInExit)
                    {
                        AssertOrFailFast(this->currentForInDepth != 0);
                        this->currentForInDepth--;
                    }
                }
                break;
            case Js::OpCode::InitForInEnumerator:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    this->currentForInDepth++;
                }
                break;
            case Js::OpCode::BrOnNotEmpty:
                // Byte code doesn't emit BrOnNotEmpty, and we have done any transformation yet.
                Assert(false);
                break;
            case Js::OpCode::BrOnEmpty:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    instr->AsBranchInstr()->GetTarget()->m_isForInExit = true;
                }
                break;
            case Js::OpCode::StFld:
            case Js::OpCode::LdFld:
            case Js::OpCode::LdFldForCallApplyTarget:
                {
                    // Try inlining of getter setter
                    if (!inlinerData->IsLdFldInlineePresent())
                    {
                        break;
                    }

                    if (!instr->IsProfiledInstr())
                    {
                        break;
                    }

                    if (!(instr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfoFlags::FldInfo_FromAccessor))
                    {
                        break;
                    }

                    bool getter = instr->m_opcode != Js::OpCode::StFld;

                    IR::Opnd *opnd = getter ? instr->GetSrc1() : instr->GetDst();
                    if (!(opnd && opnd->IsSymOpnd()))
                    {
                        break;
                    }

                    IR::SymOpnd* symOpnd = opnd->AsSymOpnd();
                    if (!symOpnd->m_sym->IsPropertySym())
                    {
                        break;
                    }
                    Assert(symOpnd->AsSymOpnd()->IsPropertySymOpnd());

                    const auto inlineCacheIndex = symOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetLdFldInlinee(inlineCacheIndex);
                    if (!inlineeData)
                    {
                        break;
                    }

                    JITTimeFunctionBody * body = inlineeData->GetBody();
                    if (!body)
                    {
                        break;
                    }

                    bool isInlinePhaseOff = PHASE_OFF(Js::InlineCandidatePhase, inlineeData) ||
                                            PHASE_OFF(Js::InlineAccessorsPhase, inlineeData) ||
                                            (getter && PHASE_OFF(Js::InlineGettersPhase, inlineeData)) ||
                                            (!getter && PHASE_OFF(Js::InlineSettersPhase, inlineeData));

                    if (isInlinePhaseOff)
                    {
                        break;
                    }

                    this->InlineGetterSetterFunction(instr, inlineeData, symThis, inlineCacheIndex, getter /*isGetter*/, &isInlined, recursiveInlineDepth);

                    break;
                }

            case Js::OpCode::NewScObjArray:
                // We know we're not going to inline these. Just break out and try to do a fixed function check.
                isCtor = true;
                isBuiltIn = true;
                break;

            case Js::OpCode::NewScObject:
                isCtor = true;
                if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc))
                {
                    break;
                }
                // fall-through

            case Js::OpCode::CallI:
                {

                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    if(!instr->IsProfiledInstr())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                    if(profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetInlinee(profileId);
                    IR::Instr * callbackDefInstr = nullptr;
                    if (inlineeData == nullptr)
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                        }

                        if (callbackDefInstr == nullptr)
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                    }

                    if (inlineeData != nullptr && inlinerData->IsPolymorphicCallSite(profileId))
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                            if (callbackDefInstr == nullptr)
                            {
                                isPolymorphic = true;
                            }
                        }
                        else
                        {
                            isPolymorphic = true;
                        }
                    }

                    if (callbackDefInstr != nullptr)
                    {
                        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callbackDefInstr->AsProfiledInstr()->u.profileId);
                        inlineeData = callbackDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        INLINE_CALLBACKS_TRACE(_u("INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n"),
                            callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif
                    }

                    if (isPolymorphic)
                    {
                        if (isCtor ||
                            (PHASE_OFF(Js::PolymorphicInlinePhase, this->topFunc) || PHASE_OFF(Js::PolymorphicInlinePhase, func)) ||
                            (this->IsInliningOutSideLoops() && !PHASE_FORCE(Js::InlinePhase, this->topFunc) && !PHASE_FORCE(Js::InlinePhase, func)))
                        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"),
                                     (isCtor? _u("true"): _u("false")), (this->topFunc != func? _u("true"):_u("false")),
                                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));

                            // TODO: Constructor polymorphic inlining

                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                        if (!PHASE_OFF(Js::FixedMethodsPhase, this->topFunc) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, this->topFunc))
                        {
                            instrNext = InlinePolymorphicFunctionUsingFixedMethods(instr, inlinerData, symThis, profileId, methodValueOpnd, &isInlined, recursiveInlineDepth);
                        }
                        else
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            instrNext = InlinePolymorphicFunction(instr, inlinerData, symThis, profileId, &isInlined, recursiveInlineDepth);
                        }
                    }
                    else
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        Js::OpCode builtInInlineCandidateOpCode;
                        ValueType builtInReturnType;

                        // If the inlinee info is the array constructor, just change the opcode to NewScObjArray
                        // so that we will inline the array allocation in lower
                        if (isCtor && inlineeData->GetFunctionInfoAddr() == this->topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
                        {
                            isBuiltIn = true;
                            instr->m_opcode = Js::OpCode::NewScObjArray;
                            instr->AsProfiledInstr()->u.profileId = Js::Constants::NoProfileId;
                            break;
                        }

                        isBuiltIn = InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineCandidateOpCode, &builtInReturnType);

                        if(!builtInReturnType.IsUninitialized() && instr->GetDst())
                        {
                            Assert(!inlineeData->HasBody());
                            AssertMsg(instr->m_opcode != Js::OpCode::NewScObjArray, "We should have broken out of the switch statement earlier on this opcode.");
                            // Value types for the array built-in calls are pulled from the profile; don't change them here.
                            if ((instr->m_opcode != Js::OpCode::NewScObjArray) ||
                                !instr->GetDst()->GetValueType().IsLikelyNativeArray())
                            {
                                // Assume that this built-in function is not going to be inlined, so the return type cannot be definite
                                instr->GetDst()->SetValueType(builtInReturnType.ToLikely());
                            }
                        }

                        bool isInlinePhaseOff = inlineeData->HasBody() ?
                            PHASE_OFF(Js::InlineCandidatePhase, inlineeData) :
                            PHASE_OFF1(Js::InlineBuiltInPhase);
                        if (isInlinePhaseOff)
                        {
                            break;
                        }

                        if(!inlineeData->HasBody() && builtInInlineCandidateOpCode == 0)
                        {
                            // This built-in function is not going to be inlined
                            break;
                        }

                        bool hasDstUsedBuiltInReturnType = false;
                        if(!inlineeData->HasBody())
                        {
                            Assert(builtInInlineCandidateOpCode != 0);
                            if(isCtor)
                            {
                                // Inlining a built-in function called as a constructor is currently not supported. Although InliningDecider
                                // already checks for this, profile data matching with a function does not take into account the difference
                                // between a constructor call and a regular function call, so need to check it again.
                                break;
                            }

                            // This built-in function should be inlined, so reset the destination's value type
                            if(!builtInReturnType.IsUninitialized())
                            {
                                if(instr->GetDst())
                                {
                                    hasDstUsedBuiltInReturnType = true;
                                    instr->GetDst()->SetValueType(builtInReturnType);
                                    if(builtInReturnType.IsDefinite())
                                    {
                                        instr->GetDst()->SetValueTypeFixed();
                                    }
                                }
                            }
                        }
                        else
                        {

                            if (!inlineeData->GetBody()->HasProfileInfo())        // Don't try to inline a function if it doesn't have profile data
                            {
                                break;
                            }

                            uint16 constantArguments = 0;
                            if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                            {
                                instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                                    IR::Opnd *src1 = argInstr->GetSrc1();
                                    if (!src1->IsRegOpnd())
                                    {
                                        return false;
                                    }
                                    StackSym *sym = src1->AsRegOpnd()->m_sym;
                                    if (sym->IsIntConst())
                                    {
                                        if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                                        {
                                            StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                            Assert(dstSym->IsSingleDef());
                                            Assert(dstSym->IsArgSlotSym());
                                            Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                            if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                            {
                                                return true;
                                            }
                                            constantArguments |= (1 << argCount);
                                        }
                                    }
                                    return false;
                                });
                            }

                            if (!inliningHeuristics.BackendInlineIntoInliner(inlineeData,
                                func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                                this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                            {
                                break;
                            }

                        }


                        instrNext = builtInInlineCandidateOpCode != 0 ?
                            this->InlineBuiltInFunction(instr, inlineeData, builtInInlineCandidateOpCode, inlinerData, symThis, &isInlined, profileId, recursiveInlineDepth, instr) :
                            this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, callbackDefInstr, recursiveInlineDepth);
                        if (!isInlined && hasDstUsedBuiltInReturnType)
                        {
                            // We haven't actually inlined the builtin, we need to revert the value type to likely
                            instr->GetDst()->UnsetValueTypeFixed();
                            instr->GetDst()->SetValueType(instr->GetDst()->GetValueType().ToLikely());
                        }
                    }
                    if(++this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        // getterSetter inline caches are shared and we have no way of knowing how many more are present
                        if (!inlinerData->IsLdFldInlineePresent() && !doFixedMethods)
                        {
                            return ;
                        }
                    }
                    break;
                }
            case Js::OpCode::AsmJsCallI:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount() || !instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }
                if (PHASE_OFF(Js::InlineCandidatePhase, inlineeData))
                {
                    break;
                }

                // Don't try to inline a function if it doesn't have profile data
                if (!inlineeData->GetBody()->HasProfileInfo())
                {
                    break;
                }

                uint16 constantArguments = 0;
                if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                {
                    instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                        IR::Opnd *src1 = argInstr->GetSrc1();
                        if (!src1->IsRegOpnd())
                        {
                            return false;
                        }
                        StackSym *sym = src1->AsRegOpnd()->m_sym;
                        if (sym->IsIntConst())
                        {
                            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                            {
                                StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                Assert(dstSym->IsSingleDef());
                                Assert(dstSym->IsArgSlotSym());
                                Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                {
                                    return true;
                                }
                                constantArguments |= (1 << argCount);
                            }
                        }
                        return false;
                    });
                }

                if (!inliningHeuristics.BackendInlineIntoInliner(
                    inlineeData, func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                    this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                {
                    break;
                }

                instrNext = this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, nullptr, recursiveInlineDepth);

                if (++this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    return;
                }

                break;
            }
            case Js::OpCode::CallIExtended:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    break;
                }

                if (!instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }

                if (Lowerer::IsSpreadCall(instr))
                {
                    InlineSpread(instr);
                }
                break;
            }

            case Js::OpCode::ArgOut_A:
                InlConstFoldArg(instr, callerArgOuts, callerArgOutCount);
                break;

            case Js::OpCode::LdThis:
                Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetDst()->AsRegOpnd()->m_sym;
                break;

            case Js::OpCode::CheckThis:
                // Is this possible? Can we be walking an inlinee here? Doesn't hurt to support this case...
                Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetSrc1()->AsRegOpnd()->m_sym;
                break;

            default:
                {
                    if (loopTop && instr->IsBranchInstr())
                    {
                        // Look for the back edge to loopTop.
                        IR::BranchInstr *branch = instr->AsBranchInstr();
                        IR::LabelInstr *labelDestination = branch->GetTarget();
                        if (labelDestination == loopTop) // We found the back edge
                        {
                            backEdgeCount--;
                            if (backEdgeCount == 0) // We have seen all the back edges, hence we are outside loop now.
                            {
                                Assert(this->isInLoop > 0);
                                --this->isInLoop;
                                loopTop = nullptr;
                            }
                        }
                    }
                }

            }
        }

        // If we chose not to inline, let's try to optimize this call if it uses a fixed method
        if (!isInlined)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::NewScObject:
            case Js::OpCode::NewScObjArray:
                isCtor = true;
                // intentionally fall through.
            case Js::OpCode::CallI:
                {
                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                    TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                    StackSym* originalCallTargetStackSym = instr->GetSrc1()->GetStackSym();
                    bool originalCallTargetOpndIsJITOpt = instr->GetSrc1()->GetIsJITOptimizedReg();
                    bool safeThis = false;
                    if (TryOptimizeCallInstrWithFixedMethod(instr, nullptr, isPolymorphic /*isPolymorphic*/, isBuiltIn /*isBuiltIn*/, isCtor /*isCtor*/, false /*isInlined*/, safeThis /*unused here*/))
                    {
                        Assert(originalCallTargetStackSym != nullptr);

                        // Insert a ByteCodeUsesInstr to make sure the methodValueDstOpnd's constant value is captured by any
                        // bailout that occurs between CheckFixedMethodField and CallI.
                        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(instr);
                        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
                        instr->InsertBefore(useCallTargetInstr);

                        // Split NewScObject into NewScObjectNoCtor and CallI, but don't touch NewScObjectArray.
                        if (instr->m_opcode == Js::OpCode::NewScObject && !PHASE_OFF(Js::SplitNewScObjectPhase, this->topFunc))
                        {
                            SplitConstructorCall(instr, false, true);
                        }
                    }
                    else if (instr->m_opcode == Js::OpCode::NewScObjArray)
                    {
                        if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeArray())
                        {
                            // We expect to create a native array here, so we'll insert a check against the
                            // expected call target, which requires a bailout.
                            instr = instr->ConvertToBailOutInstr(instr, IR::BailOutOnNotNativeArray);
                        }
                    }
                }
                break;
            }
        }
    } NEXT_INSTR_EDITING;

    INLINE_FLUSH();
}